

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O0

void __thiscall catalog::LoadIM_RM(catalog *this,IndexManager *IM,RecordManager *RM)

{
  pointer this_00;
  bool bVar1;
  reference ppTVar2;
  pointer ppVar3;
  _Base_ptr this_01;
  reference pvVar4;
  ulong uVar5;
  size_type sVar6;
  vector<TableInfo,_std::allocator<TableInfo>_> local_128;
  int local_10c;
  undefined1 local_108 [4];
  int i_2;
  vector<TableInfo,_std::allocator<TableInfo>_> TS;
  undefined1 local_c0 [8];
  IndexInfo i_1;
  _Self local_50;
  iterator it;
  TableInfo *T;
  undefined1 local_38 [4];
  int i;
  vector<IndexInfo,_std::allocator<IndexInfo>_> IndexList;
  RecordManager *RM_local;
  IndexManager *IM_local;
  catalog *this_local;
  
  IndexList.super__Vector_base<IndexInfo,_std::allocator<IndexInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)RM;
  std::vector<IndexInfo,_std::allocator<IndexInfo>_>::vector
            ((vector<IndexInfo,_std::allocator<IndexInfo>_> *)local_38);
  for (T._4_4_ = 0; T._4_4_ < this->tableNumber; T._4_4_ = T._4_4_ + 1) {
    ppTVar2 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                        (&this->TableInfoList,(long)T._4_4_);
    it._M_node = (_Base_ptr)*ppTVar2;
    local_50._M_node =
         (_Base_ptr)
         std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin(&((value_type)it._M_node)->indexInfo);
    while( true ) {
      i_1._96_8_ = std::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(it._M_node + 5));
      bVar1 = std::operator!=(&local_50,(_Self *)&i_1.field_0x60);
      if (!bVar1) break;
      IndexInfo::IndexInfo((IndexInfo *)local_c0);
      std::__cxx11::string::operator=((string *)&i_1.field_0x20,(string *)it._M_node);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_50);
      std::__cxx11::string::operator=((string *)&i_1,(string *)&ppVar3->second);
      this_01 = it._M_node + 2;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_50);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)this_01,(long)ppVar3->first);
      local_c0._4_4_ = *pvVar4;
      std::vector<IndexInfo,_std::allocator<IndexInfo>_>::push_back
                ((vector<IndexInfo,_std::allocator<IndexInfo>_> *)local_38,(value_type *)local_c0);
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_50,0);
      IndexInfo::~IndexInfo((IndexInfo *)local_c0);
    }
  }
  std::vector<IndexInfo,_std::allocator<IndexInfo>_>::vector
            ((vector<IndexInfo,_std::allocator<IndexInfo>_> *)
             &TS.super__Vector_base<TableInfo,_std::allocator<TableInfo>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<IndexInfo,_std::allocator<IndexInfo>_> *)local_38);
  IndexManager::LoadAllBpTree
            (IM,(vector<IndexInfo,_std::allocator<IndexInfo>_> *)
                &TS.super__Vector_base<TableInfo,_std::allocator<TableInfo>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  std::vector<IndexInfo,_std::allocator<IndexInfo>_>::~vector
            ((vector<IndexInfo,_std::allocator<IndexInfo>_> *)
             &TS.super__Vector_base<TableInfo,_std::allocator<TableInfo>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<TableInfo,_std::allocator<TableInfo>_>::vector
            ((vector<TableInfo,_std::allocator<TableInfo>_> *)local_108);
  local_10c = 0;
  while( true ) {
    uVar5 = (ulong)local_10c;
    sVar6 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::size(&this->TableInfoList);
    this_00 = IndexList.super__Vector_base<IndexInfo,_std::allocator<IndexInfo>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    if (sVar6 <= uVar5) break;
    ppTVar2 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                        (&this->TableInfoList,(long)local_10c);
    std::vector<TableInfo,_std::allocator<TableInfo>_>::push_back
              ((vector<TableInfo,_std::allocator<TableInfo>_> *)local_108,*ppTVar2);
    local_10c = local_10c + 1;
  }
  std::vector<TableInfo,_std::allocator<TableInfo>_>::vector
            (&local_128,(vector<TableInfo,_std::allocator<TableInfo>_> *)local_108);
  RecordManager::LoadAllRecordSet((RecordManager *)this_00,&local_128);
  std::vector<TableInfo,_std::allocator<TableInfo>_>::~vector(&local_128);
  std::vector<TableInfo,_std::allocator<TableInfo>_>::~vector
            ((vector<TableInfo,_std::allocator<TableInfo>_> *)local_108);
  std::vector<IndexInfo,_std::allocator<IndexInfo>_>::~vector
            ((vector<IndexInfo,_std::allocator<IndexInfo>_> *)local_38);
  return;
}

Assistant:

void catalog::LoadIM_RM(IndexManager& IM,RecordManager& RM){
    //load bptree record
    std::vector<IndexInfo> IndexList;
    for(int i = 0 ; i < tableNumber ; i ++){
        TableInfo* T = TableInfoList[i];
        auto it = T->indexInfo.begin();
        while(it!=T->indexInfo.end()){
            IndexInfo i;
            i.tableName = T->tableName;
            i.indexName = it->second;
            i.type = T->type[it->first];
            IndexList.push_back(i);
            it++;
        }
    }
    IM.LoadAllBpTree(IndexList);
    std::vector<TableInfo> TS;
    for(int i = 0 ; i < TableInfoList.size();i++){
        TS.push_back(*(TableInfoList[i]));
    }
    RM.LoadAllRecordSet(TS);
}